

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerGLSL::is_stage_output_block_member_masked
          (CompilerGLSL *this,SPIRVariable *var,uint32_t index,bool strip_array)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *type;
  _Node_iterator_base<spirv_cross::LocationComponentPair,_true> _Var3;
  BuiltIn builtin;
  BuiltIn local_34;
  key_type local_30;
  
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(var->super_IVariant).field_0xc);
  bVar1 = Compiler::has_decoration(&this->super_Compiler,(ID)(type->super_IVariant).self.id,Block);
  if (bVar1) {
    local_34 = BuiltInMax;
    bVar1 = Compiler::is_member_builtin(&this->super_Compiler,type,index,&local_34);
    if (bVar1) {
      local_30.location = local_34;
      _Var3._M_cur = (__node_type *)
                     ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count(&(this->masked_output_builtins)._M_h,&local_30.location);
    }
    else {
      uVar2 = get_declared_member_location(this,var,index,strip_array);
      local_30.component =
           Compiler::get_member_decoration
                     (&this->super_Compiler,(TypeID)(type->super_IVariant).self.id,index,Component);
      local_30.location = uVar2;
      _Var3._M_cur = (__node_type *)
                     ::std::
                     _Hashtable<spirv_cross::LocationComponentPair,_spirv_cross::LocationComponentPair,_std::allocator<spirv_cross::LocationComponentPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::LocationComponentPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find(&(this->masked_output_locations)._M_h,&local_30);
    }
    bVar1 = _Var3._M_cur != (__node_type *)0x0;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CompilerGLSL::is_stage_output_block_member_masked(const SPIRVariable &var, uint32_t index, bool strip_array) const
{
	auto &type = get<SPIRType>(var.basetype);
	bool is_block = has_decoration(type.self, DecorationBlock);
	if (!is_block)
		return false;

	BuiltIn builtin = BuiltInMax;
	if (is_member_builtin(type, index, &builtin))
	{
		return is_stage_output_builtin_masked(builtin);
	}
	else
	{
		uint32_t location = get_declared_member_location(var, index, strip_array);
		uint32_t component = get_member_decoration(type.self, index, DecorationComponent);
		return is_stage_output_location_masked(location, component);
	}
}